

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reservoir_sample.cpp
# Opt level: O2

idx_t __thiscall duckdb::ReservoirSample::FillReservoir(ReservoirSample *this,DataChunk *chunk)

{
  unique_ptr<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>,_true> *this_00;
  sel_t *__p;
  idx_t iVar1;
  pointer pRVar2;
  reference pvVar3;
  DataChunk *this_;
  InternalException *this_01;
  size_type __n;
  ulong uVar4;
  SelectionVector sel_for_input_chunk;
  vector<duckdb::LogicalType,_true> types;
  
  this_00 = &this->reservoir_chunk;
  if ((this->reservoir_chunk).
      super_unique_ptr<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>_>._M_t.
      super___uniq_ptr_impl<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>_>.
      _M_t.
      super__Tuple_impl<0UL,_duckdb::ReservoirChunk_*,_std::default_delete<duckdb::ReservoirChunk>_>
      .super__Head_base<0UL,_duckdb::ReservoirChunk_*,_false>._M_head_impl == (ReservoirChunk *)0x0)
  {
    if (0x800 < chunk->count) {
      this_01 = (InternalException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&types,
                 "Creating sample with DataChunk that is larger than the fixed sample size",
                 (allocator *)&sel_for_input_chunk);
      InternalException::InternalException(this_01,(string *)&types);
      __cxa_throw(this_01,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    DataChunk::GetTypes(&types,chunk);
    CreateNewSampleChunk
              ((ReservoirSample *)&sel_for_input_chunk,(vector<duckdb::LogicalType,_true> *)this,
               (idx_t)&types);
    __p = sel_for_input_chunk.sel_vector;
    sel_for_input_chunk.sel_vector = (sel_t *)0x0;
    ::std::__uniq_ptr_impl<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>_>::
    reset((__uniq_ptr_impl<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>_> *)
          this_00,(pointer)__p);
    ::std::unique_ptr<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>_>::
    ~unique_ptr((unique_ptr<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>_> *)
                &sel_for_input_chunk);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
              (&types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
  }
  iVar1 = GetActiveSampleCount(this);
  pRVar2 = unique_ptr<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>,_true>::
           operator->(this_00);
  uVar4 = this->sample_count;
  if ((pRVar2->chunk).count < uVar4) {
    pRVar2 = unique_ptr<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>,_true>::
             operator->(this_00);
    uVar4 = uVar4 - (pRVar2->chunk).count;
    if (chunk->count <= uVar4) {
      uVar4 = chunk->count;
    }
    GetRandomizedVector((vector<unsigned_int,_true> *)&types,this,(uint32_t)uVar4,(uint32_t)uVar4);
    SelectionVector::SelectionVector(&sel_for_input_chunk,uVar4);
    for (__n = 0; uVar4 != __n; __n = __n + 1) {
      (this->sel).sel_vector[iVar1 + __n] = (int)iVar1 + (int)__n;
      pvVar3 = vector<unsigned_int,_true>::get<true>((vector<unsigned_int,_true> *)&types,__n);
      sel_for_input_chunk.sel_vector[__n] = *pvVar3;
    }
    this_ = &unique_ptr<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>,_true>::
             operator->(this_00)->chunk;
    UpdateSampleAppend(this,this_,chunk,&sel_for_input_chunk,uVar4);
    this->sel_size = this->sel_size + uVar4;
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&sel_for_input_chunk.selection_data.internal.
                super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    ::std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&types);
  }
  else {
    uVar4 = 0;
  }
  return uVar4;
}

Assistant:

idx_t ReservoirSample::FillReservoir(DataChunk &chunk) {

	idx_t ingested_count = 0;
	if (!reservoir_chunk) {
		if (chunk.size() > FIXED_SAMPLE_SIZE) {
			throw InternalException("Creating sample with DataChunk that is larger than the fixed sample size");
		}
		auto types = chunk.GetTypes();
		// create a new sample chunk to store new samples
		reservoir_chunk = CreateNewSampleChunk(types, GetReservoirChunkCapacity<idx_t>());
	}

	idx_t actual_sample_index_start = GetActiveSampleCount();
	D_ASSERT(reservoir_chunk->chunk.ColumnCount() == chunk.ColumnCount());

	if (reservoir_chunk->chunk.size() < sample_count) {
		ingested_count = MinValue<idx_t>(sample_count - reservoir_chunk->chunk.size(), chunk.size());
		auto random_other_sel =
		    GetRandomizedVector(static_cast<uint32_t>(ingested_count), static_cast<uint32_t>(ingested_count));
		SelectionVector sel_for_input_chunk(ingested_count);
		for (idx_t i = 0; i < ingested_count; i++) {
			sel.set_index(actual_sample_index_start + i, actual_sample_index_start + i);
			sel_for_input_chunk.set_index(i, random_other_sel[i]);
		}
		UpdateSampleAppend(reservoir_chunk->chunk, chunk, sel_for_input_chunk, ingested_count);
		sel_size += ingested_count;
	}
	D_ASSERT(GetActiveSampleCount() <= sample_count);
	D_ASSERT(GetActiveSampleCount() >= ingested_count);
	// always return how many tuples were ingested
	return ingested_count;
}